

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *y,
          Instruction *where)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t uVar1;
  int iVar2;
  uint32_t type_id;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Instruction *pIVar4;
  Operand *local_250;
  allocator<spvtools::opt::Operand> local_22d;
  uint32_t local_22c;
  iterator local_228;
  undefined8 local_220;
  SmallVector<unsigned_int,_2UL> local_218;
  uint32_t local_1ec;
  iterator local_1e8;
  undefined8 local_1e0;
  SmallVector<unsigned_int,_2UL> local_1d8;
  uint local_1ac;
  iterator local_1a8;
  undefined8 local_1a0;
  SmallVector<unsigned_int,_2UL> local_198;
  uint32_t local_16c;
  iterator local_168;
  undefined8 local_160;
  SmallVector<unsigned_int,_2UL> local_158;
  Operand local_130;
  Operand OStack_100;
  Operand OStack_d0;
  Operand OStack_a0;
  iterator local_70;
  _func_int **local_68;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_60;
  Instruction *smin_inst;
  uint32_t ywidth;
  uint32_t xwidth;
  uint32_t smin_id;
  uint32_t glsl_insts_id;
  Instruction *where_local;
  Instruction *y_local;
  Instruction *x_local;
  TypeManager *tm_local;
  GraphicsRobustAccessPass *this_local;
  
  _smin_id = where;
  where_local = y;
  y_local = x;
  x_local = (Instruction *)tm;
  tm_local = (TypeManager *)this;
  xwidth = GetGlslInsts(this);
  ywidth = Pass::TakeNextId(&this->super_Pass);
  pIVar4 = x_local;
  uVar1 = opt::Instruction::type_id(y_local);
  pTVar3 = analysis::TypeManager::GetType((TypeManager *)pIVar4,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[9])();
  smin_inst._4_4_ = analysis::Integer::width((Integer *)CONCAT44(extraout_var,iVar2));
  pIVar4 = x_local;
  uVar1 = opt::Instruction::type_id(where_local);
  pTVar3 = analysis::TypeManager::GetType((TypeManager *)pIVar4,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[9])();
  smin_inst._0_4_ = analysis::Integer::width((Integer *)CONCAT44(extraout_var_00,iVar2));
  pIVar4 = _smin_id;
  if (smin_inst._4_4_ == (uint32_t)smin_inst) {
    type_id = opt::Instruction::type_id(y_local);
    uVar1 = ywidth;
    local_16c = xwidth;
    local_168 = &local_16c;
    local_160 = 1;
    init_list_02._M_len = 1;
    init_list_02._M_array = local_168;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_02);
    Operand::Operand(&local_130,SPV_OPERAND_TYPE_ID,&local_158);
    local_1ac = 0x26;
    local_1a8 = &local_1ac;
    local_1a0 = 1;
    init_list_01._M_len = 1;
    init_list_01._M_array = local_1a8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_198,init_list_01);
    Operand::Operand(&OStack_100,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_198);
    local_1ec = opt::Instruction::result_id(y_local);
    local_1e8 = &local_1ec;
    local_1e0 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_1e8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1d8,init_list_00);
    Operand::Operand(&OStack_d0,SPV_OPERAND_TYPE_ID,&local_1d8);
    local_22c = opt::Instruction::result_id(where_local);
    local_228 = &local_22c;
    local_220 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_228;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_218,init_list);
    Operand::Operand(&OStack_a0,SPV_OPERAND_TYPE_ID,&local_218);
    local_70 = &local_130;
    local_68 = (_func_int **)0x4;
    std::allocator<spvtools::opt::Operand>::allocator(&local_22d);
    __l._M_len = (size_type)local_68;
    __l._M_array = local_70;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_60,__l,&local_22d);
    pIVar4 = InsertInst(this,pIVar4,OpExtInst,type_id,uVar1,&local_60);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_60)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_22d);
    local_250 = (Operand *)&local_70;
    do {
      local_250 = local_250 + -1;
      Operand::~Operand(local_250);
    } while (local_250 != &local_130);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_218);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1d8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_198);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
    return pIVar4;
  }
  __assert_fail("xwidth == ywidth",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x26e,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeUMinInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* y,
    Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t smin_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto ywidth = tm.GetType(y->type_id())->AsInteger()->width();
  assert(xwidth == ywidth);
  (void)xwidth;
  (void)ywidth;
  auto* smin_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), smin_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450UMin}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {y->result_id()}},
      });
  return smin_inst;
}